

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O2

void helics::loadTags(value *section,
                     function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *tagAction)

{
  _Hash_node_base _Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  value_type *v;
  size_t sVar4;
  table_type *ptVar5;
  basic_value<toml::type_config> *tagValue_00;
  basic_value<toml::type_config> *tagValue_01;
  value *extraout_RDX;
  value *element;
  value *extraout_RDX_00;
  long lVar6;
  size_t ii;
  ulong uVar7;
  __node_base *p_Var8;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_01;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tagPair;
  value_type tagValue;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  string local_118;
  basic_value<toml::type_config> local_f8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"tags",(allocator<char> *)&local_158);
  bVar3 = toml::basic_value<toml::type_config>::contains(section,(key_type *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"tags",(allocator<char> *)&local_118);
    v = toml::basic_value<toml::type_config>::at(section,&local_158.first);
    toml::basic_value<toml::type_config>::basic_value(&local_f8,v);
    std::__cxx11::string::~string((string *)&local_158);
    if (local_f8.type_ == array) {
      lVar6 = 0;
      uVar7 = 0;
      while( true ) {
        sVar4 = toml::basic_value<toml::type_config>::size(&local_f8);
        if (sVar4 <= uVar7) break;
        getTagPair<toml::basic_value<toml::type_config>>
                  (&local_158,(helics *)(*(long *)local_f8.field_1.integer_.value + lVar6),
                   tagValue_01);
        if (local_158.first._M_string_length != 0) {
          __args_1._M_str = local_158.second._M_dataplus._M_p;
          __args_1._M_len = local_158.second._M_string_length;
          __args._M_str = local_158.first._M_dataplus._M_p;
          __args._M_len = local_158.first._M_string_length;
          CLI::std::
          function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)tagAction,__args,__args_1);
        }
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_158);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 200;
      }
    }
    else {
      getTagPair<toml::basic_value<toml::type_config>>(&local_158,(helics *)&local_f8,tagValue_00);
      if (local_158.first._M_string_length == 0) {
        if (local_f8.type_ == table) {
          ptVar5 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(&local_f8);
          p_Var8 = &(ptVar5->_M_h)._M_before_begin;
          element = extraout_RDX;
          while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
            _Var1._M_nxt = p_Var8[1]._M_nxt;
            p_Var2 = *(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var8 + 2))->_M_max_load_factor;
            fileops::tomlAsString_abi_cxx11_(&local_118,(fileops *)(p_Var8 + 5),element);
            __args_1_01._M_str = local_118._M_dataplus._M_p;
            __args_1_01._M_len = local_118._M_string_length;
            __args_01._M_str = (char *)_Var1._M_nxt;
            __args_01._M_len = (size_t)p_Var2;
            CLI::std::
            function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)tagAction,__args_01,__args_1_01);
            std::__cxx11::string::~string((string *)&local_118);
            element = extraout_RDX_00;
          }
        }
      }
      else {
        __args_1_00._M_str = local_158.second._M_dataplus._M_p;
        __args_1_00._M_len = local_158.second._M_string_length;
        __args_00._M_str = local_158.first._M_dataplus._M_p;
        __args_00._M_len = local_158.first._M_string_length;
        CLI::std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)tagAction,__args_00,__args_1_00);
      }
      CLI::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_158);
    }
    toml::basic_value<toml::type_config>::~basic_value(&local_f8);
  }
  return;
}

Assistant:

void loadTags(const toml::value& section,
              const std::function<void(std::string_view, std::string_view)>& tagAction)
{
    if (section.contains("tags")) {
        auto tagValue = section.at("tags");
        if (tagValue.is_array()) {
            for (std::size_t ii = 0; ii < tagValue.size(); ++ii) {
                auto tagPair = getTagPair(tagValue[ii]);
                if (!tagPair.first.empty()) {
                    tagAction(tagPair.first, tagPair.second);
                }
            }
        } else {
            auto tagPair = getTagPair(tagValue);
            if (!tagPair.first.empty()) {
                tagAction(tagPair.first, tagPair.second);
            } else if (tagValue.is_table()) {
                for (auto& values : tagValue.as_table()) {
                    tagAction(values.first, fileops::tomlAsString(values.second));
                }
            }
        }
    }
}